

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::start_server(raft_server *this,bool skip_initial_election_timeout)

{
  uint uVar1;
  element_type *peVar2;
  long *plVar3;
  int iVar4;
  nuraft_global_mgr *this_00;
  EventAwaiter *pEVar5;
  int *piVar6;
  ptr<raft_params> params;
  string local_58;
  thread local_38;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  context::get_params((context *)&stack0xffffffffffffffd0);
  this_00 = nuraft_global_mgr::get_instance();
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (nuraft_global_mgr *)0x0) {
    if (peVar2 != (element_type *)0x0) {
      iVar4 = (*peVar2->_vptr_logger[7])();
      if (3 < iVar4) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_58,"global manager is detected. will use shared thread pool")
        ;
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"start_server",0x10d,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
    }
    LOCK();
    (this->commit_bg_stopped_)._M_base._M_i = true;
    UNLOCK();
    LOCK();
    (this->append_bg_stopped_)._M_base._M_i = true;
    UNLOCK();
    nuraft_global_mgr::init_raft_server(this_00,this);
LAB_00233fd5:
    if (skip_initial_election_timeout) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar4 = (*peVar2->_vptr_logger[7])();
        if (3 < iVar4) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_58,
                     "skip initialization of election timer by given parameter, waiting for the first heartbeat"
                    );
          (*peVar2->_vptr_logger[8])
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"start_server",0x121,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
      }
      LOCK();
      (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      election_timer_allowed_)._M_base._M_i = false;
      UNLOCK();
      plVar3 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                            .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar3 + 0x20))
                (plVar3,(this->state_).
                        super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->election_timer_allowed_)._M_base._M_i & 1U) == 0) {
        if (peVar2 != (element_type *)0x0) {
          iVar4 = (*peVar2->_vptr_logger[7])();
          if (3 < iVar4) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_58,
                       "skip initialization of election timer by previously saved state, waiting for the first heartbeat"
                      );
            (*peVar2->_vptr_logger[8])
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"start_server",0x129,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
          }
        }
      }
      else {
        if (peVar2 != (element_type *)0x0) {
          iVar4 = (*peVar2->_vptr_logger[7])();
          if (3 < iVar4) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_58,"wait for HB, for %d + [%d, %d] ms",
                       (ulong)*(uint *)((long)&local_30[1]._vptr_state_mgr + 4),
                       (ulong)*(uint *)((long)&local_30->_vptr_state_mgr + 4),
                       (ulong)*(uint *)&local_30->_vptr_state_mgr);
            (*peVar2->_vptr_logger[8])
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"start_server",0x12f,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
          }
        }
        uVar1 = *(uint *)((long)&local_30[1]._vptr_state_mgr + 4);
        if (0 < (long)(int)uVar1) {
          local_58._M_dataplus._M_p = (pointer)((ulong)uVar1 / 1000);
          local_58._M_string_length =
               ((long)local_58._M_dataplus._M_p * -1000 + (long)(int)uVar1) * 1000000;
          do {
            iVar4 = nanosleep((timespec *)&local_58,(timespec *)&local_58);
            if (iVar4 != -1) break;
            piVar6 = __errno_location();
          } while (*piVar6 == 4);
        }
        restart_election_timer(this);
      }
    }
    timer_helper::reset(&this->priority_change_timer_);
    timer_helper::set_duration_us
              (&this->vote_init_timer_,(long)*(int *)&local_30[0xc]._vptr_state_mgr * 1000);
    timer_helper::reset(&this->vote_init_timer_);
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar4 = (*peVar2->_vptr_logger[7])();
      if (4 < iVar4) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_58,"server %d started",(ulong)(uint)this->id_);
        (*peVar2->_vptr_logger[8])
                  (peVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"start_server",0x137,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
    }
    if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    }
    return;
  }
  if (peVar2 != (element_type *)0x0) {
    iVar4 = (*peVar2->_vptr_logger[7])();
    if (3 < iVar4) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_58,
                 "global manager does not exist. will use local thread for commit and append");
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"start_server",0x114,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
  }
  local_58._M_dataplus._M_p = (pointer)commit_in_bg;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = (size_type)this;
  std::thread::thread<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*))()>,,void>
            (&local_38,(_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*))()> *)&local_58);
  if ((this->bg_commit_thread_)._M_id._M_thread == 0) {
    (this->bg_commit_thread_)._M_id._M_thread = (native_handle_type)local_38._M_id._M_thread;
    pEVar5 = (EventAwaiter *)operator_new(0x60);
    (pEVar5->status)._M_i = idle;
    (pEVar5->cvLock).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pEVar5->cvLock).super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)((long)&(pEVar5->cvLock).super___mutex_base._M_mutex + 0x10) = 0;
    (pEVar5->cvLock).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (pEVar5->cvLock).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    std::condition_variable::condition_variable(&pEVar5->cv);
    this->bg_append_ea_ = pEVar5;
    local_58._M_dataplus._M_p = (pointer)append_entries_in_bg;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = (size_type)this;
    std::thread::thread<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*))()>,,void>
              (&local_38,(_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*))()> *)&local_58)
    ;
    if ((this->bg_append_thread_)._M_id._M_thread == 0) {
      (this->bg_append_thread_)._M_id._M_thread = (native_handle_type)local_38._M_id._M_thread;
      goto LAB_00233fd5;
    }
  }
  std::terminate();
}

Assistant:

void raft_server::start_server(bool skip_initial_election_timeout)
{
    ptr<raft_params> params = ctx_->get_params();
    nuraft_global_mgr* mgr = nuraft_global_mgr::get_instance();
    if (mgr) {
        p_in("global manager is detected. will use shared thread pool");
        commit_bg_stopped_ = true;
        append_bg_stopped_ = true;
        mgr->init_raft_server(this);

    } else {
        p_in("global manager does not exist. "
             "will use local thread for commit and append");
        bg_commit_thread_ = std::thread(std::bind(&raft_server::commit_in_bg, this));

        bg_append_ea_ = new EventAwaiter();
        bg_append_thread_ = std::thread(std::bind(&raft_server::append_entries_in_bg, this));
    }

    if (skip_initial_election_timeout) {
        // Issue #23:
        //   During remediation, the node (to be added) shouldn't be
        //   even a temp leader (to avoid local commit). We provide
        //   this option for that purpose.
        p_in("skip initialization of election timer by given parameter, "
             "waiting for the first heartbeat");
        // Make this status persistent, so as to make it not
        // trigger any election even after process restart.
        state_->allow_election_timer(false);
        ctx_->state_mgr_->save_state(*state_);

    } else if (!state_->is_election_timer_allowed()) {
        p_in("skip initialization of election timer by previously saved state, "
             "waiting for the first heartbeat");

    } else {
        p_in("wait for HB, for %d + [%d, %d] ms",
             params->rpc_failure_backoff_,
             params->election_timeout_lower_bound_,
             params->election_timeout_upper_bound_);
        std::this_thread::sleep_for( std::chrono::milliseconds
                                     (params->rpc_failure_backoff_) );
        restart_election_timer();
    }
    priority_change_timer_.reset();
    vote_init_timer_.set_duration_ms(params->grace_period_of_lagging_state_machine_);
    vote_init_timer_.reset();
    p_db("server %d started", id_);
}